

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O1

void __thiscall
CVmImageWriter::write_entrypt
          (CVmImageWriter *this,uint32_t entry_ofs,size_t method_hdr_size,size_t exc_entry_size,
          size_t line_entry_size,size_t dbg_hdr_size,size_t dbg_lclsym_hdr_size,
          size_t dbg_frame_hdr_size,int dbg_vsn_id)

{
  uint16_t tmp_7;
  uint16_t tmp_5;
  uint32_t local_38;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined2 local_28;
  
  local_2e = (undefined2)dbg_hdr_size;
  local_30 = (undefined2)line_entry_size;
  local_32 = (undefined2)exc_entry_size;
  local_34 = (undefined2)method_hdr_size;
  local_2c = (undefined2)dbg_lclsym_hdr_size;
  local_2a = (undefined2)dbg_vsn_id;
  local_28 = (undefined2)dbg_frame_hdr_size;
  local_38 = entry_ofs;
  begin_block(this,"ENTP",1);
  CVmFile::write_bytes(this->fp_,(char *)&local_38,0x12);
  end_block(this);
  return;
}

Assistant:

void CVmImageWriter::write_entrypt(uint32_t entry_ofs, size_t method_hdr_size,
                                   size_t exc_entry_size,
                                   size_t line_entry_size,
                                   size_t dbg_hdr_size,
                                   size_t dbg_lclsym_hdr_size,
                                   size_t dbg_frame_hdr_size,
                                   int dbg_vsn_id)
{
    char buf[32];
    
    /* prepare the block's contents */
    oswp4(buf, entry_ofs);
    oswp2(buf+4, method_hdr_size);
    oswp2(buf+6, exc_entry_size);
    oswp2(buf+8, line_entry_size);
    oswp2(buf+10, dbg_hdr_size);
    oswp2(buf+12, dbg_lclsym_hdr_size);
    oswp2(buf+14, dbg_vsn_id);
    oswp2(buf+16, dbg_frame_hdr_size);

    /* open the block, write the data, and close the block */
    begin_block("ENTP", TRUE);
    fp_->write_bytes(buf, 18);
    end_block();
}